

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Minisat::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  ClauseAllocator *this_00;
  int iVar1;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *pOVar2;
  int iVar3;
  vec<unsigned_int,_int> *pvVar4;
  int j;
  long lVar5;
  int iVar6;
  long lVar7;
  CRef cr;
  int local_40;
  uint local_3c;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *local_38;
  
  if (this->use_simplification == true) {
    local_38 = &this->occurs;
    this_00 = &(this->super_Solver).ca;
    for (local_40 = 0; pOVar2 = local_38, local_40 < (this->super_Solver).next_var;
        local_40 = local_40 + 1) {
      OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
      ::clean(local_38,&local_40);
      pvVar4 = (pOVar2->occs).map.data + local_40;
      lVar7 = 0;
      for (lVar5 = 0; lVar5 < pvVar4->sz; lVar5 = lVar5 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)pvVar4->data + lVar7),to);
        lVar7 = lVar7 + 4;
      }
    }
    iVar3 = (this->subsumption_queue).end;
    iVar6 = 0;
    iVar1 = (this->subsumption_queue).first;
    if (iVar3 < iVar1) {
      iVar6 = (this->subsumption_queue).buf.sz;
    }
    for (iVar6 = (iVar3 - iVar1) + iVar6; 0 < iVar6; iVar6 = iVar6 + -1) {
      iVar3 = (this->subsumption_queue).first;
      local_3c = (this->subsumption_queue).buf.data[iVar3];
      iVar3 = iVar3 + 1;
      if (iVar3 == (this->subsumption_queue).buf.sz) {
        iVar3 = 0;
      }
      (this->subsumption_queue).first = iVar3;
      if (((this->super_Solver).ca.ra.memory[local_3c] & 3) == 0) {
        ClauseAllocator::reloc(this_00,&local_3c,to);
        Queue<unsigned_int>::insert(&this->subsumption_queue,local_3c);
      }
    }
    ClauseAllocator::reloc(this_00,&this->bwdsub_tmpunit,to);
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator& to)
{
    if (!use_simplification) return;

    // All occurs lists:
    //
    for (int i = 0; i < nVars(); i++){
        occurs.clean(i);
        vec<CRef>& cs = occurs[i];
        for (int j = 0; j < cs.size(); j++)
            ca.reloc(cs[j], to);
    }

    // Subsumption queue:
    //
    for (int i = subsumption_queue.size(); i > 0; i--){
        CRef cr = subsumption_queue.peek(); subsumption_queue.pop();
        if (ca[cr].mark()) continue;
        ca.reloc(cr, to);
        subsumption_queue.insert(cr);
    }
        
    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}